

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

void vera::flipPixelsVertically<unsigned_short>
               (unsigned_short *_pixels,int _width,int _height,int _bytes_per_pixel)

{
  long lVar1;
  void *__ptr;
  unsigned_short *local_40;
  unsigned_short *high;
  unsigned_short *low;
  unsigned_short *row;
  size_t stride;
  int _bytes_per_pixel_local;
  int _height_local;
  int _width_local;
  unsigned_short *_pixels_local;
  
  lVar1 = (long)(_width * _bytes_per_pixel);
  __ptr = malloc(lVar1 << 1);
  local_40 = _pixels + (_height + -1) * lVar1;
  for (high = _pixels; high < local_40; high = high + lVar1) {
    memcpy(__ptr,high,lVar1 << 1);
    memcpy(high,local_40,lVar1 << 1);
    memcpy(local_40,__ptr,lVar1 << 1);
    local_40 = local_40 + -lVar1;
  }
  free(__ptr);
  return;
}

Assistant:

void flipPixelsVertically(T *_pixels, int _width, int _height, int _bytes_per_pixel) {
    const size_t stride = _width * _bytes_per_pixel;
    T *row = (T*)malloc(stride * sizeof(T));
    T *low = _pixels;
    T *high = &_pixels[(_height - 1) * stride];
    for (; low < high; low += stride, high -= stride) {
        std::memcpy(row, low, stride * sizeof(T));
        std::memcpy(low, high, stride * sizeof(T));
        std::memcpy(high, row, stride * sizeof(T));
    }
    free(row);
}